

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3_module *psVar1;
  int iVar2;
  Table *pTVar3;
  HashElem *pHVar4;
  char *pcVar5;
  Module *pMod;
  long lVar6;
  uchar uVar7;
  uchar uVar8;
  char *pcVar9;
  sqlite3 *db;
  char *local_40;
  sqlite3_module *local_38;
  
  iVar2 = sqlite3ReadSchema(pParse);
  if (iVar2 != 0) {
    return (Table *)0x0;
  }
  pTVar3 = sqlite3FindTable(pParse->db,zName,zDbase);
  if (pTVar3 != (Table *)0x0) {
    return pTVar3;
  }
  pcVar9 = "no such view";
  if ((flags & 1) == 0) {
    pcVar9 = "no such table";
  }
  db = pParse->db;
  iVar2 = sqlite3FindDbName(db,zDbase);
  if (0 < iVar2) goto LAB_0011c470;
  pHVar4 = findElementWithHash(&db->aModule,zName,(uint *)0x0);
  pMod = (Module *)pHVar4->data;
  if (pMod == (Module *)0x0) {
    if (zName == (char *)0x0) goto LAB_0011c470;
    lVar6 = 0;
    do {
      if ((ulong)(byte)zName[lVar6] == 0) {
        uVar8 = ""[(byte)"pragma_"[lVar6]];
        uVar7 = '\0';
LAB_0011c683:
        if (uVar7 != uVar8) goto LAB_0011c470;
        break;
      }
      uVar7 = ""[(byte)zName[lVar6]];
      uVar8 = ""[(byte)"pragma_"[lVar6]];
      if (uVar7 != uVar8) goto LAB_0011c683;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
    pMod = sqlite3PragmaVtabRegister(db,zName);
    if (pMod == (Module *)0x0) goto LAB_0011c470;
    db = pParse->db;
  }
  psVar1 = pMod->pModule;
  local_40 = (char *)0x0;
  if (pMod->pEpoTab != (Table *)0x0) {
    return pMod->pEpoTab;
  }
  if (((psVar1->xCreate ==
        (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)0x0) ||
      (psVar1->xCreate == psVar1->xConnect)) &&
     (local_38 = psVar1, pTVar3 = (Table *)sqlite3DbMallocZero(db,0x80), pTVar3 != (Table *)0x0)) {
    pcVar5 = sqlite3DbStrDup(db,pMod->zName);
    pTVar3->zName = pcVar5;
    if (pcVar5 == (char *)0x0) {
      sqlite3DbFreeNN(db,pTVar3);
    }
    else {
      pMod->pEpoTab = pTVar3;
      pTVar3->nTabRef = 1;
      pTVar3->pSchema = db->aDb->pSchema;
      pTVar3->iPKey = -1;
      pcVar5 = sqlite3DbStrDup(db,pcVar5);
      addModuleArgument(db,pTVar3,pcVar5);
      addModuleArgument(db,pTVar3,(char *)0x0);
      pcVar5 = sqlite3DbStrDup(db,pTVar3->zName);
      addModuleArgument(db,pTVar3,pcVar5);
      iVar2 = vtabCallConstructor(db,pTVar3,pMod,local_38->xConnect,&local_40);
      pcVar5 = local_40;
      if (iVar2 == 0) {
        return pMod->pEpoTab;
      }
      sqlite3ErrorMsg(pParse,"%s");
      if (pcVar5 != (char *)0x0) {
        sqlite3DbFreeNN(db,pcVar5);
      }
      pTVar3 = pMod->pEpoTab;
      if (pTVar3 != (Table *)0x0) {
        *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 2;
        sqlite3DeleteTable(db,pTVar3);
        pMod->pEpoTab = (Table *)0x0;
      }
    }
  }
LAB_0011c470:
  if ((flags & 2) == 0) {
    if (zDbase == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar9,zName);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar9,zDbase,zName);
    }
    pParse->checkSchema = '\x01';
  }
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return 0;
  }

  p = sqlite3FindTable(pParse->db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( sqlite3FindDbName(pParse->db, zDbase)<1 ){
      /* If zName is the not the name of a table in the schema created using
      ** CREATE, then check to see if it is the name of an virtual table that
      ** can be an eponymous virtual table. */
      Module *pMod = (Module*)sqlite3HashFind(&pParse->db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(pParse->db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        return pMod->pEpoTab;
      }
    }
#endif
    if( (flags & LOCATE_NOERR)==0 ){
      if( zDbase ){
        sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
      }else{
        sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
      }
      pParse->checkSchema = 1;
    }
  }

  return p;
}